

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npc.cpp
# Opt level: O1

void __thiscall NPC::Act(NPC *this)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  World *pWVar4;
  long lVar5;
  _List_node_base *p_Var6;
  pointer ppNVar7;
  NPC *pNVar8;
  Character *pCVar9;
  bool bVar10;
  char cVar11;
  Direction direction;
  bool bVar12;
  int iVar13;
  uint uVar14;
  WalkResult WVar15;
  NPC_Data *pNVar16;
  ENF_Data *pEVar17;
  mapped_type *pmVar18;
  list<Character_*,_std::allocator<Character_*>_> *plVar19;
  _List_node_base *p_Var20;
  uint uVar21;
  uint uVar22;
  Character *pCVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  pointer ppNVar27;
  double dVar28;
  Character *local_b0;
  key_type local_a0;
  double local_80;
  double local_78;
  key_type local_70;
  key_type local_50;
  
  pNVar16 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar17 = NPC_Data::ENF(pNVar16);
  if ((pEVar17->child != 0) && (this->parent == (NPC *)0x0)) {
    ppNVar7 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppNVar27 = (this->map->npcs).super__Vector_base<NPC_*,_std::allocator<NPC_*>_>._M_impl.
                    super__Vector_impl_data._M_start; ppNVar27 != ppNVar7; ppNVar27 = ppNVar27 + 1)
    {
      pNVar8 = *ppNVar27;
      pNVar16 = World::GetNpcData(pNVar8->map->world,(short)pNVar8->id);
      pEVar17 = NPC_Data::ENF(pNVar16);
      if (pEVar17->boss != 0) {
        this->parent = pNVar8;
        break;
      }
    }
  }
  iVar13 = util::rand();
  this->last_act = (double)iVar13 / 1000.0 + this->last_act;
  if (this->spawn_type == '\a') {
    return;
  }
  pWVar4 = this->map->world;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"NPCChaseDistance","");
  pmVar18 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar4->config,&local_a0);
  uVar14 = util::variant::GetInt(pmVar18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  pNVar16 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar17 = NPC_Data::ENF(pNVar16);
  if (pEVar17->type != Passive) {
    pNVar16 = World::GetNpcData(this->map->world,(short)this->id);
    pEVar17 = NPC_Data::ENF(pNVar16);
    if (pEVar17->type != Aggressive) {
      local_b0 = (Character *)0x0;
      goto LAB_0017b71f;
    }
  }
  p_Var20 = (this->damagelist).
            super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var20 == (_List_node_base *)&this->damagelist) {
    uVar3 = 0;
    local_b0 = (Character *)0x0;
  }
  else {
    local_b0 = (Character *)0x0;
    uVar3 = 0;
    do {
      lVar5 = (long)(p_Var20[1]._M_next)->_M_next;
      bVar10 = true;
      if ((*(Map **)(lVar5 + 0x470) == this->map) && (*(char *)(lVar5 + 0xd) == '\0')) {
        local_78 = (double)p_Var20[1]._M_next[1]._M_next;
        local_80 = Timer::GetTime();
        pWVar4 = this->map->world;
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"NPCBoredTimer","");
        pmVar18 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar4->config,&local_a0);
        dVar28 = util::variant::GetFloat(pmVar18);
        bVar10 = local_78 < local_80 - dVar28;
        bVar12 = true;
      }
      else {
        bVar12 = false;
      }
      if ((bVar12) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2)) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar10) {
        p_Var6 = p_Var20[1]._M_next;
        pCVar23 = (Character *)p_Var6->_M_next;
        uVar21 = (uint)pCVar23->x - (uint)this->x;
        uVar22 = -uVar21;
        if (0 < (int)uVar21) {
          uVar22 = uVar21;
        }
        uVar24 = (uint)pCVar23->y - (uint)this->y;
        uVar21 = -uVar24;
        if (0 < (int)uVar24) {
          uVar21 = uVar24;
        }
        uVar22 = (uVar21 & 0xff) + (uVar22 & 0xff) + (uint)((uVar21 & 0xff) + (uVar22 & 0xff) == 0);
        if ((uVar22 < (uVar14 & 0xff)) ||
           ((uVar22 == (uVar14 & 0xff) && ((int)(uint)uVar3 < *(int *)&p_Var6->_M_prev)))) {
          uVar3 = *(ushort *)&p_Var6->_M_prev;
          uVar14 = uVar22;
          local_b0 = pCVar23;
        }
      }
      p_Var20 = p_Var20->_M_next;
    } while (p_Var20 != (_List_node_base *)&this->damagelist);
  }
  pNVar8 = this->parent;
  if (pNVar8 != (NPC *)0x0) {
    for (p_Var20 = (pNVar8->damagelist).
                   super__List_base<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>,_std::allocator<std::unique_ptr<NPC_Opponent,_std::default_delete<NPC_Opponent>_>_>_>
                   ._M_impl._M_node.super__List_node_base._M_next;
        p_Var20 != (_List_node_base *)&pNVar8->damagelist; p_Var20 = p_Var20->_M_next) {
      lVar5 = (long)(p_Var20[1]._M_next)->_M_next;
      bVar10 = true;
      if ((*(Map **)(lVar5 + 0x470) == this->map) && (*(char *)(lVar5 + 0xd) == '\0')) {
        local_78 = (double)p_Var20[1]._M_next[1]._M_next;
        local_80 = Timer::GetTime();
        pWVar4 = this->map->world;
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"NPCBoredTimer","");
        pmVar18 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&pWVar4->config,&local_70);
        dVar28 = util::variant::GetFloat(pmVar18);
        bVar10 = local_78 < local_80 - dVar28;
        bVar12 = true;
      }
      else {
        bVar12 = false;
      }
      if ((bVar12) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2)) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (!bVar10) {
        p_Var6 = p_Var20[1]._M_next;
        pCVar23 = (Character *)p_Var6->_M_next;
        uVar21 = (uint)pCVar23->x - (uint)this->x;
        uVar22 = -uVar21;
        if (0 < (int)uVar21) {
          uVar22 = uVar21;
        }
        uVar24 = (uint)pCVar23->y - (uint)this->y;
        uVar21 = -uVar24;
        if (0 < (int)uVar24) {
          uVar21 = uVar24;
        }
        uVar22 = (uVar21 & 0xff) + (uVar22 & 0xff) + (uint)((uVar21 & 0xff) + (uVar22 & 0xff) == 0);
        if ((uVar22 < (uVar14 & 0xff)) ||
           ((uVar22 == (uVar14 & 0xff) && ((int)(uint)uVar3 < *(int *)&p_Var6->_M_prev)))) {
          uVar3 = *(ushort *)&p_Var6->_M_prev;
          uVar14 = uVar22;
          local_b0 = pCVar23;
        }
      }
    }
  }
LAB_0017b71f:
  pNVar16 = World::GetNpcData(this->map->world,(short)this->id);
  pEVar17 = NPC_Data::ENF(pNVar16);
  if ((pEVar17->type == Aggressive) ||
     ((this->parent != (NPC *)0x0 && (local_b0 != (Character *)0x0)))) {
    pWVar4 = this->map->world;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"NPCChaseDistance","");
    pmVar18 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar4->config,&local_50);
    uVar22 = util::variant::GetInt(pmVar18);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    p_Var20 = (this->map->characters).super__List_base<Character_*,_std::allocator<Character_*>_>.
              _M_impl._M_node.super__List_node_base._M_next;
    plVar19 = &this->map->characters;
    pCVar23 = local_b0;
    if (p_Var20 != (_List_node_base *)plVar19) {
      uVar21 = uVar14 & 0xff;
      if ((byte)uVar22 <= (byte)uVar14) {
        uVar21 = uVar22 & 0xff;
      }
      if (local_b0 == (Character *)0x0) {
        uVar21 = uVar22 & 0xff;
      }
      do {
        pCVar9 = (Character *)p_Var20[1]._M_next;
        if (((pCVar9->hidden & 4) == 0) && ((pCVar9->nointeract & 4) == 0)) {
          iVar25 = (uint)pCVar9->x - (uint)this->x;
          iVar13 = -iVar25;
          if (0 < iVar25) {
            iVar13 = iVar25;
          }
          iVar26 = (uint)pCVar9->y - (uint)this->y;
          iVar25 = -iVar26;
          if (0 < iVar26) {
            iVar25 = iVar26;
          }
          uVar14 = iVar25 + iVar13 + (uint)(iVar25 + iVar13 == 0);
          uVar21 = uVar21 & 0xff;
          if (uVar14 < uVar21) {
            pCVar23 = pCVar9;
            uVar21 = uVar14;
          }
        }
        p_Var20 = p_Var20->_M_next;
      } while (p_Var20 != (_List_node_base *)plVar19);
    }
    if (pCVar23 != (Character *)0x0) {
      local_b0 = pCVar23;
    }
  }
  if (local_b0 == (Character *)0x0) {
    if (this->walk_idle_for == 0) {
      iVar13 = util::rand();
    }
    else {
      this->walk_idle_for = this->walk_idle_for + -1;
      iVar13 = 0xb;
    }
    if (iVar13 - 1U < 6) {
      Map::Walk(this->map,this,this->direction);
    }
    if (iVar13 - 7U < 3) {
      iVar25 = util::rand();
      Map::Walk(this->map,this,(Direction)iVar25);
    }
    if (iVar13 == 10) {
      iVar13 = util::rand();
      this->walk_idle_for = iVar13;
    }
  }
  else {
    uVar21 = (uint)this->x - (uint)local_b0->x;
    bVar1 = this->y;
    bVar2 = local_b0->y;
    uVar22 = (uint)bVar1 - (uint)bVar2;
    uVar14 = -uVar21;
    if (0 < (int)uVar21) {
      uVar14 = uVar21;
    }
    uVar24 = -uVar22;
    if (0 < (int)uVar22) {
      uVar24 = uVar22;
    }
    if (((char)uVar14 != '\x01') || (bVar1 != bVar2)) {
      if ((this->x != local_b0->x) || ((uVar24 & 0xff) != 1 && bVar1 != bVar2)) {
        cVar11 = (char)((int)uVar21 >> 0x1f);
        direction = cVar11 * -2 + DIRECTION_LEFT;
        if ((uVar14 & 0xff) <= (uVar24 & 0xff)) {
          direction = (-1 < (int)uVar22) * '\x02';
        }
        this->direction = direction;
        WVar15 = Map::Walk(this->map,this,direction);
        if (WVar15 != WalkFail) {
          return;
        }
        if ((this->direction & ~DIRECTION_UP) == DIRECTION_DOWN) {
          this->direction = cVar11 * -2 + DIRECTION_LEFT;
        }
        WVar15 = Map::Walk(this->map,this,this->direction);
        if (WVar15 != WalkFail) {
          return;
        }
        iVar13 = util::rand();
        Map::Walk(this->map,this,(Direction)iVar13);
        return;
      }
    }
    Attack(this,local_b0);
  }
  return;
}

Assistant:

void NPC::Act()
{
	// Needed for the server startup spawn to work properly
	if (this->ENF().child && !this->parent)
	{
		UTIL_FOREACH(this->map->npcs, npc)
		{
			if (npc->ENF().boss)
			{
				this->parent = npc;
				break;
			}
		}
	}

	this->last_act += double(util::rand(int(this->act_speed * 750.0), int(this->act_speed * 1250.0))) / 1000.0;

	if (this->spawn_type == 7)
	{
		return;
	}

	Character *attacker = 0;
	unsigned char attacker_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);
	unsigned short attacker_damage = 0;

	if (this->ENF().type == ENF::Passive || this->ENF().type == ENF::Aggressive)
	{
		UTIL_FOREACH_CREF(this->damagelist, opponent)
		{
			if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
			{
				continue;
			}

			int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
			{
				attacker = opponent->attacker;
				attacker_damage = opponent->damage;
				attacker_distance = distance;
			}
		}

		if (this->parent)
		{
			UTIL_FOREACH_CREF(this->parent->damagelist, opponent)
			{
				if (opponent->attacker->map != this->map || opponent->attacker->nowhere || opponent->last_hit < Timer::GetTime() - static_cast<double>(this->map->world->config["NPCBoredTimer"]))
				{
					continue;
				}

				int distance = util::path_length(opponent->attacker->x, opponent->attacker->y, this->x, this->y);

				if (distance == 0)
					distance = 1;

				if ((distance < attacker_distance) || (distance == attacker_distance && opponent->damage > attacker_damage))
				{
					attacker = opponent->attacker;
					attacker_damage = opponent->damage;
					attacker_distance = distance;
				}
			}
		}
	}

	if (this->ENF().type == ENF::Aggressive || (this->parent && attacker))
	{
		Character *closest = 0;
		unsigned char closest_distance = static_cast<int>(this->map->world->config["NPCChaseDistance"]);

		if (attacker)
		{
			closest = attacker;
			closest_distance = std::min(closest_distance, attacker_distance);
		}

		UTIL_FOREACH(this->map->characters, character)
		{
			if (character->IsHideNpc() || !character->CanInteractCombat())
				continue;

			int distance = util::path_length(character->x, character->y, this->x, this->y);

			if (distance == 0)
				distance = 1;

			if (distance < closest_distance)
			{
				closest = character;
				closest_distance = distance;
			}
		}

		if (closest)
		{
			attacker = closest;
		}
	}
	
	if (attacker)
	{
		int xdiff = this->x - attacker->x;
		int ydiff = this->y - attacker->y;
		int absxdiff = std::abs(xdiff);
		int absydiff = std::abs(ydiff);

		if ((absxdiff == 1 && absydiff == 0) || (absxdiff == 0 && absydiff == 1) || (absxdiff == 0 && absydiff == 0))
		{
			this->Attack(attacker);
			return;
		}
		else if (absxdiff > absydiff)
		{
			if (xdiff < 0)
			{
				this->direction = DIRECTION_RIGHT;
			}
			else
			{
				this->direction = DIRECTION_LEFT;
			}
		}
		else
		{
			if (ydiff < 0)
			{
				this->direction = DIRECTION_DOWN;
			}
			else
			{
				this->direction = DIRECTION_UP;
			}
		}

		if (this->Walk(this->direction) == Map::WalkFail)
		{
			if (this->direction == DIRECTION_UP || this->direction == DIRECTION_DOWN)
			{
				if (xdiff < 0)
				{
					this->direction = DIRECTION_RIGHT;
				}
				else
				{
					this->direction = DIRECTION_LEFT;
				}
			}

			if (this->Walk(static_cast<Direction>(this->direction)) == Map::WalkFail)
			{
				this->Walk(static_cast<Direction>(util::rand(0,3)));
			}
		}
	}
	else
	{
		// Random walking

		int act;
		if (this->walk_idle_for == 0)
		{
			act = util::rand(1,10);
		}
		else
		{
			--this->walk_idle_for;
			act = 11;
		}

		if (act >= 1 && act <= 6) // 60% chance walk foward
		{
			this->Walk(this->direction);
		}

		if (act >= 7 && act <= 9) // 30% change direction
		{
			this->Walk(static_cast<Direction>(util::rand(0,3)));
		}

		if (act == 10) // 10% take a break
		{
			this->walk_idle_for = util::rand(1,4);
		}
	}
}